

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_decoding.h
# Opt level: O1

bool draco::anon_unknown_52::DecodeVarintUnsigned<unsigned_long>
               (int depth,unsigned_long *out_val,DecoderBuffer *buffer)

{
  long lVar1;
  byte bVar2;
  unsigned_long uVar3;
  bool bVar4;
  ulong uVar5;
  
  if (10 < (uint)depth) {
    return false;
  }
  lVar1 = buffer->pos_ + 1;
  if (buffer->data_size_ < lVar1) {
LAB_00180ae9:
    bVar4 = false;
  }
  else {
    bVar2 = buffer->data_[buffer->pos_];
    buffer->pos_ = lVar1;
    if ((char)bVar2 < '\0') {
      bVar4 = DecodeVarintUnsigned<unsigned_long>(depth + 1,out_val,buffer);
      if (!bVar4) goto LAB_00180ae9;
      uVar3 = *out_val;
      *out_val = uVar3 << 7;
      uVar5 = (ulong)(bVar2 & 0x7f) | uVar3 << 7;
    }
    else {
      uVar5 = (ulong)bVar2;
    }
    *out_val = uVar5;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool DecodeVarintUnsigned(int depth, IntTypeT *out_val, DecoderBuffer *buffer) {
  constexpr IntTypeT max_depth = sizeof(IntTypeT) + 1 + (sizeof(IntTypeT) >> 3);
  if (depth > max_depth) {
    return false;
  }
  // Coding of unsigned values.
  // 0-6 bit - data
  // 7 bit - next byte?
  uint8_t in;
  if (!buffer->Decode(&in)) {
    return false;
  }
  if (in & (1 << 7)) {
    // Next byte is available, decode it first.
    if (!DecodeVarintUnsigned<IntTypeT>(depth + 1, out_val, buffer)) {
      return false;
    }
    // Append decoded info from this byte.
    *out_val <<= 7;
    *out_val |= in & ((1 << 7) - 1);
  } else {
    // Last byte reached
    *out_val = in;
  }
  return true;
}